

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::ClearPartialCollect(Recycler *this)

{
  Type_conflict pSVar1;
  code *pcVar2;
  bool bVar3;
  Type_conflict *ppSVar4;
  SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  long *plVar5;
  long extraout_RDX;
  undefined8 *in_FS_OFFSET;
  code *local_68;
  Recycler *this_local;
  FreeFuncType freeFunc;
  NodeBase *next;
  NodeBase *current;
  
  bVar3 = DoQueueTrackedObject(this);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x10a1,"(!this->DoQueueTrackedObject())","!this->DoQueueTrackedObject()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  (this->autoHeap).unusedPartialCollectFreeBytes = 0;
  this->partialUncollectedAllocBytes = 0;
  this_00 = &this->clientTrackedObjectList;
  ppSVar4 = SListNodeBase<Memory::ArenaAllocator>::Next
                      (&this_00->super_SListNodeBase<Memory::ArenaAllocator>);
  next = *ppSVar4;
  while (bVar3 = SListBase<void_*,_Memory::ArenaAllocator,_RealCount>::IsHead(this_00,next),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    ppSVar4 = SListNodeBase<Memory::ArenaAllocator>::Next(next);
    pSVar1 = *ppSVar4;
    local_68 = (code *)TypeAllocatorFunc<Memory::ArenaAllocator,_void_*>::GetFreeFunc();
    plVar5 = (long *)((long)&(this->clientTrackedObjectAllocator).
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             .super_Allocator.outOfMemoryFunc + extraout_RDX);
    if (((ulong)local_68 & 1) != 0) {
      local_68 = *(code **)(local_68 + *plVar5 + -1);
    }
    (*local_68)(plVar5,next,0x10);
    next = pSVar1;
  }
  SListBase<void_*,_Memory::ArenaAllocator,_RealCount>::Reset(this_00);
  this->uncollectedNewPageCountPartialCollect = 0xffffffffffffffff;
  return;
}

Assistant:

void
Recycler::ClearPartialCollect()
{
#if ENABLE_CONCURRENT_GC
    Assert(!this->DoQueueTrackedObject());
#endif
    this->autoHeap.unusedPartialCollectFreeBytes = 0;
    this->partialUncollectedAllocBytes = 0;
    this->clientTrackedObjectList.Clear(&this->clientTrackedObjectAllocator);
    this->uncollectedNewPageCountPartialCollect = (size_t)-1;
}